

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASCFile.cpp
# Opt level: O0

bool __thiscall ASCFile::read_asc(ASCFile *this,path *filepath,offset_in_ASCFile_to_subr parser)

{
  bool bVar1;
  int iVar2;
  size_type sVar3;
  undefined8 uVar4;
  void *pvVar5;
  reference ppcVar6;
  long in_RCX;
  vector<char,_std::allocator<char>_> *in_RDX;
  long in_RDI;
  char *s;
  char *p;
  char *line;
  iterator line_it;
  vector<char_*,_std::allocator<char_*>_> lines;
  char *arena_end;
  char *arena;
  string *in_stack_000001e0;
  path *in_stack_000001e8;
  size_t file_buf_size;
  vector<char,_std::allocator<char>_> buf;
  vector<char,_std::allocator<char>_> *in_stack_fffffffffffffc68;
  vector<char,_std::allocator<char>_> *in_stack_fffffffffffffc70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc78;
  vector<char,_std::allocator<char>_> *in_stack_fffffffffffffc80;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> in_stack_fffffffffffffc88;
  vector<char,_std::allocator<char>_> *this_00;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> in_stack_fffffffffffffc90;
  char *buffer;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffca0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffca8;
  string *this_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffcb0;
  undefined8 in_stack_fffffffffffffcb8;
  undefined8 local_320;
  byte *local_318;
  byte *local_310;
  char **local_308;
  __normal_iterator<char_**,_std::vector<char_*,_std::allocator<char_*>_>_> local_300 [4];
  undefined1 *local_2e0;
  char *local_2d8;
  char *local_2d0;
  char *local_2c8;
  string local_2c0 [39];
  allocator<char> local_299;
  string local_298 [32];
  string local_278 [32];
  string local_258 [32];
  string local_238 [32];
  string local_218 [32];
  string local_1f8 [32];
  string local_1d8 [32];
  string local_1b8 [32];
  size_t local_198;
  string local_190 [55];
  allocator<char> local_159;
  string local_158 [32];
  string local_138 [32];
  string local_118 [32];
  string local_f8 [32];
  string local_d8 [32];
  string local_b8 [32];
  string local_98 [32];
  string local_78 [36];
  undefined4 local_54;
  vector<char,_std::allocator<char>_> local_50;
  vector<char,_std::allocator<char>_> *local_38;
  long local_30;
  byte local_1;
  
  iVar2 = (int)((ulong)in_stack_fffffffffffffcb8 >> 0x20);
  local_38 = in_RDX;
  local_30 = in_RCX;
  bVar1 = std::filesystem::__cxx11::path::empty((path *)0x160dc1);
  if (bVar1) {
    local_1 = 0;
  }
  else {
    file_as_buffer(in_stack_000001e8,in_stack_000001e0);
    bVar1 = std::vector<char,_std::allocator<char>_>::empty(in_stack_fffffffffffffc80);
    if (bVar1) {
      local_1 = 0;
      local_54 = 1;
    }
    else {
      sVar3 = std::vector<char,_std::allocator<char>_>::size(&local_50);
      if (sVar3 < 5) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_fffffffffffffcb0,(char *)in_stack_fffffffffffffca8,
                   (allocator<char> *)in_stack_fffffffffffffca0);
        std::operator+(in_stack_fffffffffffffc78,(char *)in_stack_fffffffffffffc70);
        std::__cxx11::to_string(iVar2);
        std::operator+(in_stack_fffffffffffffca8,in_stack_fffffffffffffca0);
        std::operator+(in_stack_fffffffffffffc78,(char *)in_stack_fffffffffffffc70);
        std::operator+(in_stack_fffffffffffffc78,(char *)in_stack_fffffffffffffc70);
        std::operator+(in_stack_fffffffffffffc78,(char *)in_stack_fffffffffffffc70);
        std::operator+(in_stack_fffffffffffffc78,(char *)in_stack_fffffffffffffc70);
        std::operator+(in_stack_fffffffffffffc78,(char *)in_stack_fffffffffffffc70);
        std::__cxx11::string::operator=((string *)(in_RDI + 0x98),local_78);
        std::__cxx11::string::~string(local_78);
        std::__cxx11::string::~string(local_98);
        std::__cxx11::string::~string(local_b8);
        std::__cxx11::string::~string(local_d8);
        std::__cxx11::string::~string(local_f8);
        std::__cxx11::string::~string(local_118);
        std::__cxx11::string::~string(local_190);
        std::__cxx11::string::~string(local_138);
        std::__cxx11::string::~string(local_158);
        std::allocator<char>::~allocator(&local_159);
        uVar4 = std::__cxx11::string::c_str();
        SDL_LogError(1,"%s",uVar4);
        local_1 = 0;
        local_54 = 1;
      }
      else {
        sVar3 = std::vector<char,_std::allocator<char>_>::size(&local_50);
        local_198 = (sVar3 + 1) * 3;
        pvVar5 = calloc(1,local_198);
        *(void **)(in_RDI + 0xb8) = pvVar5;
        if (*(long *)(in_RDI + 0xb8) == 0) {
          iVar2 = (int)((ulong)&local_299 >> 0x20);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    (in_stack_fffffffffffffcb0,(char *)in_stack_fffffffffffffca8,
                     (allocator<char> *)in_stack_fffffffffffffca0);
          std::operator+(in_stack_fffffffffffffc78,(char *)in_stack_fffffffffffffc70);
          std::__cxx11::to_string(iVar2);
          std::operator+(in_stack_fffffffffffffca8,in_stack_fffffffffffffca0);
          std::operator+(in_stack_fffffffffffffc78,(char *)in_stack_fffffffffffffc70);
          std::operator+(in_stack_fffffffffffffc78,(char *)in_stack_fffffffffffffc70);
          std::operator+(in_stack_fffffffffffffc78,(char *)in_stack_fffffffffffffc70);
          std::operator+(in_stack_fffffffffffffc78,(char *)in_stack_fffffffffffffc70);
          std::operator+(in_stack_fffffffffffffc78,(char *)in_stack_fffffffffffffc70);
          this_01 = local_1b8;
          std::__cxx11::string::operator=((string *)(in_RDI + 0x98),this_01);
          std::__cxx11::string::~string(this_01);
          std::__cxx11::string::~string(local_1d8);
          std::__cxx11::string::~string(local_1f8);
          std::__cxx11::string::~string(local_218);
          std::__cxx11::string::~string(local_238);
          std::__cxx11::string::~string(local_258);
          std::__cxx11::string::~string(local_2c0);
          std::__cxx11::string::~string(local_278);
          std::__cxx11::string::~string(local_298);
          std::allocator<char>::~allocator(&local_299);
          uVar4 = std::__cxx11::string::c_str();
          SDL_LogError(1,"%s",uVar4);
          local_1 = 0;
          local_54 = 1;
        }
        else {
          local_2c8 = (char *)std::vector<char,_std::allocator<char>_>::begin
                                        (in_stack_fffffffffffffc68);
          local_2d0 = (char *)std::vector<char,_std::allocator<char>_>::end
                                        (in_stack_fffffffffffffc68);
          std::
          copy<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>,char*>
                    (in_stack_fffffffffffffc90,in_stack_fffffffffffffc88,
                     (char *)in_stack_fffffffffffffc80);
          in_stack_fffffffffffffc80 = *(vector<char,_std::allocator<char>_> **)(in_RDI + 0xb8);
          this_00 = &local_50;
          sVar3 = std::vector<char,_std::allocator<char>_>::size(this_00);
          *(undefined1 *)
           ((long)&((_Vector_impl_data *)
                   &(in_stack_fffffffffffffc80->super__Vector_base<char,_std::allocator<char>_>).
                    _M_impl.super__Tp_alloc_type)->_M_start + sVar3) = 0;
          buffer = *(char **)(in_RDI + 0xb8);
          sVar3 = std::vector<char,_std::allocator<char>_>::size(this_00);
          local_2d8 = buffer + sVar3 + 1;
          local_2e0 = (undefined1 *)(*(long *)(in_RDI + 0xb8) + -1 + local_198);
          *local_2e0 = 0;
          std::vector<char_*,_std::allocator<char_*>_>::vector
                    ((vector<char_*,_std::allocator<char_*>_> *)0x161605);
          stringfile(buffer,(vector<char_*,_std::allocator<char_*>_> *)this_00);
          local_300[0]._M_current =
               (char **)std::vector<char_*,_std::allocator<char_*>_>::begin
                                  ((vector<char_*,_std::allocator<char_*>_> *)
                                   in_stack_fffffffffffffc68);
          while( true ) {
            local_308 = (char **)std::vector<char_*,_std::allocator<char_*>_>::end
                                           ((vector<char_*,_std::allocator<char_*>_> *)
                                            in_stack_fffffffffffffc68);
            bVar1 = __gnu_cxx::operator!=
                              ((__normal_iterator<char_**,_std::vector<char_*,_std::allocator<char_*>_>_>
                                *)in_stack_fffffffffffffc70,
                               (__normal_iterator<char_**,_std::vector<char_*,_std::allocator<char_*>_>_>
                                *)in_stack_fffffffffffffc68);
            if (!bVar1) break;
            ppcVar6 = __gnu_cxx::
                      __normal_iterator<char_**,_std::vector<char_*,_std::allocator<char_*>_>_>::
                      operator*(local_300);
            local_310 = (byte *)*ppcVar6;
            __gnu_cxx::__normal_iterator<char_**,_std::vector<char_*,_std::allocator<char_*>_>_>::
            operator++(local_300);
            while (iVar2 = isspace((uint)*local_310), iVar2 != 0) {
              local_310 = local_310 + 1;
            }
            if (*local_310 != 0) {
              local_318 = local_310;
              local_320 = 0;
              in_stack_fffffffffffffc68 = local_38;
              if (((ulong)local_38 & 1) != 0) {
                in_stack_fffffffffffffc68 =
                     *(vector<char,_std::allocator<char>_> **)
                      ((long)local_38 + *(long *)(in_RDI + local_30) + -1);
              }
              in_stack_fffffffffffffc70 = local_38;
              (*(code *)in_stack_fffffffffffffc68)
                        ((long *)(in_RDI + local_30),&local_318,&local_320,&local_2d8,&local_2e0,
                         local_300);
            }
          }
          local_1 = 1;
          local_54 = 1;
          std::vector<char_*,_std::allocator<char_*>_>::~vector
                    ((vector<char_*,_std::allocator<char_*>_> *)in_stack_fffffffffffffc80);
        }
      }
    }
    std::vector<char,_std::allocator<char>_>::~vector(in_stack_fffffffffffffc80);
  }
  return (bool)(local_1 & 1);
}

Assistant:

bool ASCFile::read_asc(const filesystem::path &filepath, void (ASCFile::*parser)(char *&, char *&, char *&, char *&, line_iterator_t&)) {
	if (filepath.empty()) return false;
	std::vector<char> buf = file_as_buffer(filepath, error_msg);
	if (buf.empty()) return false;

	ENSURE_OR_FAIL(buf.size() > 4, error_msg, return false);
	size_t file_buf_size = 3 * (1 + buf.size());
	file_buf             = (char *)calloc(1, file_buf_size);
	ENSURE_OR_FAIL(file_buf != nullptr, error_msg, return false);

	std::copy(buf.begin(), buf.end(), file_buf);
	file_buf[buf.size()] = 0;
	// This is for fixing degenerate utf8
	char *arena     = &file_buf[buf.size() + 1];
	char *arena_end = file_buf + file_buf_size - 1;
	*arena_end      = 0;

	std::vector<char *> lines;
	stringfile(file_buf, lines);

	std::vector<char *>::iterator line_it = lines.begin();
	while (line_it != lines.end()) {
		char *line = *line_it;
		++line_it;

		while (isspace((uint8_t)*line)) line++;
		if (!line[0]) continue;

		char *p = line;
		char *s = nullptr;

		(this->*parser)(p, s, arena, arena_end, line_it);
	}
	return true;
}